

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O3

bool __thiscall wasm::anon_unknown_23::Heap2Local::canHandleAsLocals(Heap2Local *this,Type type)

{
  pointer pFVar1;
  pointer pFVar2;
  bool bVar3;
  HeapTypeKind HVar4;
  Struct *pSVar5;
  pointer pFVar6;
  Type local_38 [2];
  Type local_28;
  Type type_local;
  HeapType heapType;
  
  if (this == (Heap2Local *)0x1) {
    bVar3 = false;
  }
  else {
    local_28.id = (uintptr_t)this;
    type_local.id = (uintptr_t)wasm::Type::getHeapType(&local_28);
    HVar4 = HeapType::getKind((HeapType *)&type_local);
    if (HVar4 == Struct) {
      pSVar5 = HeapType::getStruct((HeapType *)&type_local);
      pFVar1 = (pSVar5->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pFVar2 = (pSVar5->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pFVar1 == pFVar2) {
        bVar3 = true;
      }
      else {
        do {
          pFVar6 = pFVar1 + 1;
          bVar3 = TypeUpdating::canHandleAsLocal((Type)(pFVar1->type).id);
          if (!bVar3) {
            return bVar3;
          }
          pFVar1 = pFVar6;
        } while (pFVar6 != pFVar2);
      }
    }
    else {
      HVar4 = HeapType::getKind((HeapType *)&type_local);
      if (HVar4 != Array) {
        __assert_fail("heapType.isArray()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                      ,0x581,"bool wasm::(anonymous namespace)::Heap2Local::canHandleAsLocals(Type)"
                     );
      }
      HeapType::getArray((HeapType *)local_38);
      bVar3 = TypeUpdating::canHandleAsLocal(local_38[0]);
    }
  }
  return bVar3;
}

Assistant:

bool canHandleAsLocals(Type type) {
    if (type == Type::unreachable) {
      return false;
    }

    auto heapType = type.getHeapType();
    if (heapType.isStruct()) {
      auto& fields = heapType.getStruct().fields;
      for (auto field : fields) {
        if (!canHandleAsLocal(field)) {
          return false;
        }
      }
      return true;
    }

    assert(heapType.isArray());
    return canHandleAsLocal(heapType.getArray().element);
  }